

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O0

Instr * Peeps::PeepUnreachableLabel(LabelInstr *deadLabel,bool isInHelper,bool *peepedRef)

{
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  LabelInstr *pLVar6;
  byte local_4a;
  bool local_3b;
  bool local_3a;
  byte local_39;
  bool wasStatementBoundaryKeptInDeadBlock;
  Instr *pIStack_38;
  bool removeLabel;
  Instr *instrReturn;
  Instr *prevFallthroughInstr;
  bool *peepedRef_local;
  LabelInstr *pLStack_18;
  bool isInHelper_local;
  LabelInstr *deadLabel_local;
  
  prevFallthroughInstr = (Instr *)peepedRef;
  peepedRef_local._7_1_ = isInHelper;
  pLStack_18 = deadLabel;
  if (deadLabel == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x3a6,"(deadLabel)","deadLabel");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  BVar4 = IR::LabelInstr::IsUnreferenced(pLStack_18);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x3a7,"(deadLabel->IsUnreferenced())","deadLabel->IsUnreferenced()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  instrReturn = &pLStack_18->super_Instr;
  do {
    pLVar6 = (LabelInstr *)IR::Instr::GetPrevRealInstrOrLabel(instrReturn);
    instrReturn = (Instr *)pLVar6;
    deadLabel_local = pLVar6;
    IVar3 = IR::Instr::GetKind((Instr *)pLVar6);
    local_3b = true;
    if (IVar3 != InstrKindLabel) {
      local_3b = IR::Instr::IsProfiledLabelInstr((Instr *)pLVar6);
    }
    bVar2 = false;
    if (local_3b != false) {
      pLVar6 = IR::Instr::AsLabelInstr(instrReturn);
      BVar4 = IR::LabelInstr::IsUnreferenced(pLVar6);
      bVar2 = BVar4 != 0;
    }
  } while (bVar2);
  bVar2 = IR::Instr::HasFallThrough(instrReturn);
  if (bVar2) {
    pIStack_38 = (pLStack_18->super_Instr).m_next;
    local_4a = 0;
    if (((byte)pLStack_18->field_0x78 >> 1 & 1) == (peepedRef_local._7_1_ & 1)) {
      local_4a = ((byte)pLStack_18->field_0x78 >> 5 & 1) != 0 ^ 0xff;
    }
    local_39 = local_4a & 1;
    if (prevFallthroughInstr != (Instr *)0x0) {
      *(byte *)&prevFallthroughInstr->_vptr_Instr = local_39;
    }
  }
  else {
    local_3a = false;
    pIStack_38 = RemoveDeadBlock((pLStack_18->super_Instr).m_next,&local_3a);
    local_39 = (local_3a ^ 0xffU) & 1;
    if (prevFallthroughInstr != (Instr *)0x0) {
      *(undefined1 *)&prevFallthroughInstr->_vptr_Instr = 1;
    }
  }
  if ((local_39 != 0) && (BVar4 = IR::LabelInstr::IsUnreferenced(pLStack_18), BVar4 != 0)) {
    IR::Instr::Remove(&pLStack_18->super_Instr);
  }
  return pIStack_38;
}

Assistant:

IR::Instr *
Peeps::PeepUnreachableLabel(IR::LabelInstr *deadLabel, const bool isInHelper, bool *const peepedRef)
{
    Assert(deadLabel);
    Assert(deadLabel->IsUnreferenced());

    IR::Instr *prevFallthroughInstr = deadLabel;
    do
    {
        prevFallthroughInstr = prevFallthroughInstr->GetPrevRealInstrOrLabel();
        // The previous dead label may have been kept around due to a StatementBoundary, see comment in RemoveDeadBlock.
    } while(prevFallthroughInstr->IsLabelInstr() && prevFallthroughInstr->AsLabelInstr()->IsUnreferenced());

    IR::Instr *instrReturn;
    bool removeLabel;

    // If code is now unreachable, delete block
    if (!prevFallthroughInstr->HasFallThrough())
    {
        bool wasStatementBoundaryKeptInDeadBlock = false;
        instrReturn = RemoveDeadBlock(deadLabel->m_next, &wasStatementBoundaryKeptInDeadBlock);

        // Remove label only if we didn't have to keep last StatementBoundary in the dead block,
        // see comment in RemoveDeadBlock.
        removeLabel = !wasStatementBoundaryKeptInDeadBlock;

        if(peepedRef)
        {
            *peepedRef = true;
        }
    }
    else
    {
        instrReturn = deadLabel->m_next;
        removeLabel =
            deadLabel->isOpHelper == isInHelper
#if DBG
            && !deadLabel->m_noHelperAssert
#endif
            ;
        if(peepedRef)
        {
            *peepedRef = removeLabel;
        }
    }

    if (removeLabel && deadLabel->IsUnreferenced())
    {
        deadLabel->Remove();
    }

    return instrReturn;
}